

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_map_custom3(ggml_compute_params *params,ggml_tensor *dst)

{
  (**(code **)dst->op_params)
            (dst,dst->src[0],dst->src[1],dst->src[2],params->ith,params->nth,
             *(undefined8 *)(dst->op_params + 4));
  return;
}

Assistant:

void ggml_compute_forward_map_custom3(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * a = dst->src[0];
    const ggml_tensor * b = dst->src[1];
    const ggml_tensor * c = dst->src[2];

    struct ggml_map_custom3_op_params p;
    memcpy(&p, dst->op_params, sizeof(p));

    p.fun(dst, a, b, c, params->ith, params->nth, p.userdata);
}